

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

Var Js::JavascriptFunction::CallFunction<true>
              (RecyclableObject *function,JavascriptMethod entryPoint,Arguments *args,
              bool useLargeArgCount)

{
  ushort uVar1;
  ScriptContext *pSVar2;
  ThreadContext *pTVar3;
  Var pvVar4;
  uint local_44;
  uint argsSize;
  uint argCount;
  bool useLargeArgCount_local;
  Arguments *args_local;
  JavascriptMethod entryPoint_local;
  RecyclableObject *function_local;
  
  if (useLargeArgCount) {
    local_44 = Arguments::GetLargeArgCountWithExtraArgs(args);
  }
  else {
    uVar1 = Arguments::GetArgCountWithExtraArgs(args);
    local_44 = (uint)uVar1;
  }
  pSVar2 = RecyclableObject::GetScriptContext(function);
  pTVar3 = ScriptContext::GetThreadContext(pSVar2);
  pSVar2 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar3,(ulong)(local_44 << 3),function,pSVar2);
  CheckIsExecutable(function,entryPoint);
  pSVar2 = RecyclableObject::GetScriptContext(function);
  pTVar3 = ScriptContext::GetThreadContext(pSVar2);
  ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar3);
  pSVar2 = RecyclableObject::GetScriptContext(function);
  pTVar3 = ScriptContext::GetThreadContext(pSVar2);
  ThreadContext::AssertJsReentrancy(pTVar3);
  pvVar4 = (Var)amd64_CallFunction(function,entryPoint,args->Info,local_44,args->Values);
  return pvVar4;
}

Assistant:

Var JavascriptFunction::CallFunction(RecyclableObject *function, JavascriptMethod entryPoint, Arguments args, bool useLargeArgCount)
    {
        // compute size of stack to reserve and make sure we have enough stack.
        uint argCount = useLargeArgCount ? args.GetLargeArgCountWithExtraArgs() : args.GetArgCountWithExtraArgs();
        uint argsSize = argCount * sizeof(Var);

        if (doStackProbe == true)
        {
            PROBE_STACK_CALL(function->GetScriptContext(), function, argsSize);
        }
#if DBG && ENABLE_NATIVE_CODEGEN
        CheckIsExecutable(function, entryPoint);
#endif

        return JS_REENTRANCY_CHECK(function->GetScriptContext()->GetThreadContext(),
            amd64_CallFunction(function, entryPoint, args.Info, argCount, &args.Values[0]));
    }